

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.cpp
# Opt level: O3

void __thiscall
Nova::Grid_Iterator_Cell<float,_1>::Grid_Iterator_Cell
          (Grid_Iterator_Cell<float,_1> *this,Grid<float,_1> *grid_input,int number_of_ghost_cells,
          T_Region *region_type,int side)

{
  int iVar1;
  T_Region TVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  (this->super_Grid_Iterator<float,_1>).grid = grid_input;
  (this->super_Grid_Iterator<float,_1>).number_of_regions = 0;
  (this->super_Grid_Iterator<float,_1>).region.min_corner = (T_STORAGE)0x7fffffff;
  (this->super_Grid_Iterator<float,_1>).region.max_corner = (T_STORAGE)0x80000001;
  (this->super_Grid_Iterator<float,_1>).regions[0].min_corner = (T_STORAGE)0x7fffffff;
  (this->super_Grid_Iterator<float,_1>).regions[0].max_corner = (T_STORAGE)0x80000001;
  (this->super_Grid_Iterator<float,_1>).regions[1].min_corner = (T_STORAGE)0x7fffffff;
  (this->super_Grid_Iterator<float,_1>).regions[1].max_corner = (T_STORAGE)0x80000001;
  (this->super_Grid_Iterator<float,_1>).index._data._M_elems[0] = 0;
  if (2 < (uint)side) {
    __assert_fail("side>=0 && side<=2*d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xe,
                  "Nova::Grid_Iterator_Cell<float, 1>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 1]"
                 );
  }
  TVar2 = *region_type;
  if ((TVar2 & ~Ghost_Region) == Boundary_Region) {
    __assert_fail("(region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xf,
                  "Nova::Grid_Iterator_Cell<float, 1>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 1]"
                 );
  }
  iVar3 = (grid_input->counts)._data._M_elems[0];
  iVar4 = 1 - number_of_ghost_cells;
  iVar1 = iVar3 + number_of_ghost_cells;
  if (TVar2 == Boundary_Interior_Region) {
    if (side == 0) {
      (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar4;
      (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = iVar4;
      (this->super_Grid_Iterator<float,_1>).number_of_regions = 2;
      (this->super_Grid_Iterator<float,_1>).regions[1].min_corner._data._M_elems[0] = iVar1;
      (this->super_Grid_Iterator<float,_1>).regions[1].max_corner._data._M_elems[0] = iVar1;
      iVar5 = iVar4;
    }
    else {
      if ((side & 1U) == 0) {
        iVar4 = iVar1;
      }
      (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
      (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar4;
      (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = iVar4;
      iVar5 = iVar4;
    }
  }
  else {
    if (TVar2 == Whole_Region) {
      iVar5 = iVar1;
      if (side != 0) {
        __assert_fail("!side",
                      "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                      ,0x14,
                      "Nova::Grid_Iterator_Cell<float, 1>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 1]"
                     );
      }
    }
    else {
      if ((number_of_ghost_cells < 1) || (TVar2 != Ghost_Region)) {
        __assert_fail("(region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                      ,0x2e,
                      "Nova::Grid_Iterator_Cell<float, 1>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 1]"
                     );
      }
      if (side == 0) {
        (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
        (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar4;
        (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = 0;
        iVar3 = (grid_input->counts)._data._M_elems[0];
        if (iVar3 < iVar1) {
          (this->super_Grid_Iterator<float,_1>).number_of_regions = 2;
          (this->super_Grid_Iterator<float,_1>).regions[1].min_corner._data._M_elems[0] = iVar3 + 1;
          (this->super_Grid_Iterator<float,_1>).regions[1].max_corner._data._M_elems[0] = iVar1;
        }
        iVar5 = 0;
        goto LAB_0011dd74;
      }
      iVar5 = 0;
      if ((side & 1U) == 0) {
        iVar4 = iVar3 + 1;
        iVar5 = iVar1;
      }
    }
    if (iVar5 < iVar4) {
      (this->super_Grid_Iterator<float,_1>).valid = false;
      return;
    }
    (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
    (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar4;
    (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = iVar5;
  }
LAB_0011dd74:
  (this->super_Grid_Iterator<float,_1>).valid = true;
  (this->super_Grid_Iterator<float,_1>).current_region = 0;
  (this->super_Grid_Iterator<float,_1>).region.min_corner._data._M_elems[0] = iVar4;
  (this->super_Grid_Iterator<float,_1>).region.max_corner._data._M_elems[0] = iVar5;
  (this->super_Grid_Iterator<float,_1>).index._data._M_elems[0] = iVar4;
  return;
}

Assistant:

Grid_Iterator_Cell<T,d>::
Grid_Iterator_Cell(const Grid<T,d>& grid_input,const int number_of_ghost_cells,const T_Region& region_type,const int side)
    :Base(grid_input)
{
    assert(side>=0 && side<=2*d);
    assert((region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region));
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:               assert(!side);
                                                    Add_Region(domain);
                                                    break;

        case Grid<T,d>::Boundary_Interior_Region:   if(!side)
                                                    {
                                                        Range<int,d> domain_copy(domain);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=domain.min_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain.min_corner(axis)=domain_copy.max_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain_copy.max_corner(axis)-1;
                                                            domain.min_corner(axis)=domain_copy.min_corner(axis)+1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=domain.min_corner(axis);
                                                        else domain.min_corner(axis)=domain.max_corner(axis);
                                                        Add_Region(domain);
                                                    }
                                                    break;

        default:                                    assert((region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0));
                                                    if(!side)
                                                    {
                                                        T_INDEX max_copy(domain.max_corner);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=0;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=max_copy(axis);
                                                            domain.min_corner(axis)=grid.counts(axis)+1;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=grid.counts(axis);
                                                            domain.min_corner(axis)=1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=0;
                                                        else domain.min_corner(axis)=grid.counts(axis)+1;
                                                        Add_Region(domain);
                                                    }
                                                    break;
    }
    Reset();
}